

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

bool __thiscall
Chainstate::PreciousBlock(Chainstate *this,BlockValidationState *state,CBlockIndex *pindex)

{
  set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_> *this_00;
  pointer ppCVar1;
  ChainstateManager *pCVar2;
  int iVar3;
  CBlockIndex *pCVar4;
  arith_uint256 *paVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  long lVar7;
  long in_FS_OFFSET;
  bool bVar8;
  bool bVar9;
  shared_ptr<const_CBlock> pblock;
  pair<std::_Rb_tree_iterator<CBlockIndex_*>,_std::_Rb_tree_iterator<CBlockIndex_*>_> pVar10;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock26;
  undefined1 local_48 [16];
  CBlockIndex *local_38;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._M_device = &cs_main.super_recursive_mutex;
  local_30._M_owns = false;
  local_38 = pindex;
  std::unique_lock<std::recursive_mutex>::lock(&local_30);
  iVar3 = base_uint<256U>::CompareTo
                    (&(pindex->nChainWork).super_base_uint<256U>,
                     &((this->m_chain).vChain.
                       super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                       super__Vector_impl_data._M_finish[-1]->nChainWork).super_base_uint<256U>);
  if (iVar3 < 0) {
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
    bVar8 = true;
  }
  else {
    iVar3 = base_uint<256U>::CompareTo
                      (&((this->m_chain).vChain.
                         super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                         super__Vector_impl_data._M_finish[-1]->nChainWork).super_base_uint<256U>,
                       &(this->m_chainman->nLastPreciousChainwork).super_base_uint<256U>);
    if (0 < iVar3) {
      this->m_chainman->nBlockReverseSequenceId = -1;
    }
    ppCVar1 = (this->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar1 ==
        (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pCVar4 = (CBlockIndex *)0x0;
    }
    else {
      pCVar4 = ppCVar1[-1];
    }
    paVar5 = &this->m_chainman->nLastPreciousChainwork;
    if (paVar5 != &pCVar4->nChainWork) {
      lVar7 = 0;
      do {
        (paVar5->super_base_uint<256U>).pn[lVar7] =
             (pCVar4->nChainWork).super_base_uint<256U>.pn[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 8);
    }
    this_00 = &this->setBlockIndexCandidates;
    pVar10 = std::
             _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
             ::equal_range(&this_00->_M_t,&local_38);
    std::
    _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
    ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar10.first._M_node,(_Base_ptr)pVar10.second._M_node);
    pCVar2 = this->m_chainman;
    iVar3 = pCVar2->nBlockReverseSequenceId;
    local_38->nSequenceId = iVar3;
    pCVar2->nBlockReverseSequenceId = iVar3 + -1;
    bVar9 = (local_38->nStatus & 0x60) != 0;
    bVar8 = (local_38->nStatus & 7) < 3;
    _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)(bVar8 || bVar9);
    if ((!bVar8 && !bVar9) && (local_38->m_chain_tx_count != 0)) {
      std::
      _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>
      ::_M_insert_unique<CBlockIndex*const&>
                ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>
                  *)this_00,&local_38);
      PruneBlockIndexCandidates(this);
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
    local_48._0_4_ = 0;
    local_48[4] = '\0';
    local_48[5] = '\0';
    local_48[6] = '\0';
    local_48[7] = '\0';
    local_48[8] = '\0';
    local_48[9] = '\0';
    local_48[10] = '\0';
    local_48[0xb] = '\0';
    local_48[0xc] = '\0';
    local_48[0xd] = '\0';
    local_48[0xe] = '\0';
    local_48[0xf] = '\0';
    pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var6._M_pi;
    pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_48;
    bVar8 = ActivateBestChain(this,state,pblock);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar8;
}

Assistant:

bool Chainstate::PreciousBlock(BlockValidationState& state, CBlockIndex* pindex)
{
    AssertLockNotHeld(m_chainstate_mutex);
    AssertLockNotHeld(::cs_main);
    {
        LOCK(cs_main);
        if (pindex->nChainWork < m_chain.Tip()->nChainWork) {
            // Nothing to do, this block is not at the tip.
            return true;
        }
        if (m_chain.Tip()->nChainWork > m_chainman.nLastPreciousChainwork) {
            // The chain has been extended since the last call, reset the counter.
            m_chainman.nBlockReverseSequenceId = -1;
        }
        m_chainman.nLastPreciousChainwork = m_chain.Tip()->nChainWork;
        setBlockIndexCandidates.erase(pindex);
        pindex->nSequenceId = m_chainman.nBlockReverseSequenceId;
        if (m_chainman.nBlockReverseSequenceId > std::numeric_limits<int32_t>::min()) {
            // We can't keep reducing the counter if somebody really wants to
            // call preciousblock 2**31-1 times on the same set of tips...
            m_chainman.nBlockReverseSequenceId--;
        }
        if (pindex->IsValid(BLOCK_VALID_TRANSACTIONS) && pindex->HaveNumChainTxs()) {
            setBlockIndexCandidates.insert(pindex);
            PruneBlockIndexCandidates();
        }
    }

    return ActivateBestChain(state, std::shared_ptr<const CBlock>());
}